

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

float Vec_StrGetF(Vec_Str_t *vOut,int *pPos)

{
  int iVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 local_1c;
  anon_union_4_2_61e65f1f tmp;
  int *pPos_local;
  Vec_Str_t *vOut_local;
  
  iVar1 = *pPos;
  *pPos = iVar1 + 1;
  cVar2 = Vec_StrEntry(vOut,iVar1);
  iVar1 = *pPos;
  *pPos = iVar1 + 1;
  cVar3 = Vec_StrEntry(vOut,iVar1);
  iVar1 = *pPos;
  *pPos = iVar1 + 1;
  cVar4 = Vec_StrEntry(vOut,iVar1);
  iVar1 = *pPos;
  *pPos = iVar1 + 1;
  cVar5 = Vec_StrEntry(vOut,iVar1);
  local_1c = (float)CONCAT13(cVar5,CONCAT12(cVar4,CONCAT11(cVar3,cVar2)));
  return local_1c;
}

Assistant:

static inline float Vec_StrGetF( Vec_Str_t * vOut, int * pPos )
{
    union { float num; unsigned char data[4]; } tmp;
    tmp.data[0] = Vec_StrEntry( vOut, (*pPos)++ );
    tmp.data[1] = Vec_StrEntry( vOut, (*pPos)++ );
    tmp.data[2] = Vec_StrEntry( vOut, (*pPos)++ );
    tmp.data[3] = Vec_StrEntry( vOut, (*pPos)++ );
    return tmp.num;
}